

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_value.c
# Opt level: O3

void assert_print_value(char *input)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  cJSON item [1];
  uchar printed [1024];
  parse_buffer local_4d0;
  printbuffer local_498;
  cJSON local_458;
  uchar local_418 [1024];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_498.depth = 0;
  local_4d0.offset = 0;
  local_4d0.depth = 0;
  local_498.buffer = local_418;
  local_498.length = 0x400;
  local_498.offset = 0;
  local_498.noalloc = 1;
  local_498.format = 0;
  local_498.hooks.allocate = global_hooks.allocate;
  local_498.hooks.deallocate = global_hooks.deallocate;
  local_498.hooks.reallocate = global_hooks.reallocate;
  local_4d0.content = (uchar *)input;
  sVar2 = strlen(input);
  local_4d0.length = sVar2 + 1;
  local_4d0.hooks.allocate = global_hooks.allocate;
  local_4d0.hooks.deallocate = global_hooks.deallocate;
  local_4d0.hooks.reallocate = global_hooks.reallocate;
  local_458.next = (cJSON *)0x0;
  local_458.prev = (cJSON *)0x0;
  local_458.child = (cJSON *)0x0;
  local_458.type = 0;
  local_458._28_4_ = 0;
  local_458.valuestring = (char *)0x0;
  local_458.valueint = 0;
  local_458._44_4_ = 0;
  local_458.valuedouble = 0.0;
  local_458.string = (char *)0x0;
  cVar1 = parse_value(&local_458,&local_4d0);
  if (cVar1 == 0) {
    UnityFail("Failed to parse value.",0x31);
  }
  cVar1 = print_value(&local_458,&local_498);
  if (cVar1 == 0) {
    UnityFail("Failed to print value.",0x33);
  }
  UnityAssertEqualString(input,local_498.buffer,"Printed value is not as expected.",0x34);
  reset(&local_458);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_print_value(const char *input)
{
    unsigned char printed[1024];
    cJSON item[1];
    printbuffer buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    parse_buffer parsebuffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.buffer = printed;
    buffer.length = sizeof(printed);
    buffer.offset = 0;
    buffer.noalloc = true;
    buffer.hooks = global_hooks;

    parsebuffer.content = (const unsigned char*)input;
    parsebuffer.length = strlen(input) + sizeof("");
    parsebuffer.hooks = global_hooks;

    memset(item, 0, sizeof(item));

    TEST_ASSERT_TRUE_MESSAGE(parse_value(item, &parsebuffer), "Failed to parse value.");

    TEST_ASSERT_TRUE_MESSAGE(print_value(item, &buffer), "Failed to print value.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(input, buffer.buffer, "Printed value is not as expected.");

    reset(item);
}